

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decAbc.c
# Opt level: O2

Abc_Obj_t * Dec_GraphToAig(Abc_Ntk_t *pNtk,Dec_Graph_t *pFForm,Vec_Ptr_t *vFaninAigs)

{
  Dec_Node_t *pDVar1;
  void *pvVar2;
  Abc_Obj_t *pAVar3;
  int i;
  long lVar4;
  long lVar5;
  
  lVar5 = 8;
  for (lVar4 = 0; lVar4 < pFForm->nLeaves; lVar4 = lVar4 + 1) {
    pDVar1 = pFForm->pNodes;
    pvVar2 = Vec_PtrEntry(vFaninAigs,(int)lVar4);
    *(void **)(&(pDVar1->eEdge0).field_0x0 + lVar5) = pvVar2;
    lVar5 = lVar5 + 0x18;
  }
  pAVar3 = Dec_GraphToNetwork(pNtk,pFForm);
  return pAVar3;
}

Assistant:

Abc_Obj_t * Dec_GraphToAig( Abc_Ntk_t * pNtk, Dec_Graph_t * pFForm, Vec_Ptr_t * vFaninAigs )
{
    Abc_Obj_t * pFunc;
    Dec_Node_t * pNode;
    int i;
    Dec_GraphForEachLeaf( pFForm, pNode, i )
        pNode->pFunc = Vec_PtrEntry( vFaninAigs, i );
    pFunc = Dec_GraphToNetwork( pNtk, pFForm );
    return pFunc;
}